

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O2

result_t * sequenceWrapper(result_t *__return_storage_ptr__,string *s,shared_ptr<Env> *envptr)

{
  Env *env_00;
  shared_ptr<SpadeArguments> args;
  args_t args_;
  Env env;
  shared_ptr<SpadeArguments> local_618;
  undefined1 local_608 [1520];
  
  parse((string *)local_608);
  Env::Env((Env *)(local_608 + 0x10));
  std::make_shared<SpadeArguments>();
  SpadeArguments::parse_args
            (local_618.super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             local_608._0_4_,(char **)local_608._8_8_);
  env_00 = (Env *)(local_608 + 0x10);
  if (*(Env **)envptr != (Env *)0x0) {
    env_00 = *(Env **)envptr;
  }
  sequenceFunc(__return_storage_ptr__,env_00,&local_618);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_618.super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Env::~Env((Env *)(local_608 + 0x10));
  args_t::~args_t((args_t *)local_608);
  return __return_storage_ptr__;
}

Assistant:

result_t sequenceWrapper(const string &s, shared_ptr<Env>& envptr) {
    args_t args_ = parse(s);
    Env env;
    shared_ptr<SpadeArguments> args = make_shared<SpadeArguments>();
    args->parse_args(args_.argc, args_.argv);
    if (envptr == nullptr) {
        return sequenceFunc(env, args);
    } else {
        return sequenceFunc(*envptr, args);
    }
}